

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  int iVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  
  iVar2 = 0;
  cVar3 = '\0';
  iVar1 = 1;
switchD_005160b0_caseD_4:
  do {
    iVar5 = iVar1;
    pcVar4 = ptr;
    ptr = pcVar4 + 1;
    uVar6 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar4[1]);
    iVar1 = iVar5;
  } while (0x1a < uVar6 - 3);
  switch(uVar6) {
  case 3:
    if (iVar2 < attsMax) {
      atts[iVar2].normalized = '\0';
    }
  default:
    goto switchD_005160b0_caseD_4;
  case 5:
    if ((iVar5 == 0) && (iVar5 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
      iVar5 = 1;
    }
    ptr = pcVar4 + 2;
    iVar1 = iVar5;
    goto switchD_005160b0_caseD_4;
  case 6:
    if ((iVar5 == 0) && (iVar5 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
      iVar5 = 1;
    }
    ptr = pcVar4 + 3;
    iVar1 = iVar5;
    goto switchD_005160b0_caseD_4;
  case 7:
    if ((iVar5 == 0) && (iVar5 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
      iVar5 = 1;
    }
    ptr = pcVar4 + 4;
    iVar1 = iVar5;
    goto switchD_005160b0_caseD_4;
  case 9:
  case 10:
    iVar1 = 0;
    if (((iVar5 != 1) && (iVar1 = iVar5, iVar5 == 2)) && (iVar1 = 2, iVar2 < attsMax)) {
      atts[iVar2].normalized = '\0';
      iVar1 = 2;
    }
    goto switchD_005160b0_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_005160b0_caseD_b;
  case 0xc:
    if (iVar5 == 2) {
      iVar1 = 2;
      if (cVar3 == '\f') {
        if (iVar2 < attsMax) {
          atts[iVar2].valueEnd = ptr;
        }
        iVar2 = iVar2 + 1;
        cVar3 = '\f';
        iVar1 = 0;
      }
      goto switchD_005160b0_caseD_4;
    }
    cVar3 = '\f';
    break;
  case 0xd:
    if (iVar5 == 2) {
      iVar1 = 2;
      if (cVar3 == '\r') {
        if (iVar2 < attsMax) {
          atts[iVar2].valueEnd = ptr;
        }
        iVar2 = iVar2 + 1;
        cVar3 = '\r';
        iVar1 = 0;
      }
      goto switchD_005160b0_caseD_4;
    }
    cVar3 = '\r';
    break;
  case 0x15:
    iVar1 = 0;
    if (((iVar5 != 1) && (iVar1 = iVar5, iVar5 == 2)) && (iVar1 = 2, iVar2 < attsMax)) {
      iVar1 = 2;
      if ((atts[iVar2].normalized != '\0') &&
         (((pcVar4[1] != 0x20 || (ptr == atts[iVar2].valuePtr)) ||
          (((ulong)(byte)pcVar4[2] == 0x20 ||
           (iVar1 = 2, cVar3 == *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar4[2]))))))) {
        atts[iVar2].normalized = '\0';
        iVar1 = 2;
      }
    }
    goto switchD_005160b0_caseD_4;
  case 0x16:
  case 0x18:
  case 0x1d:
    if ((iVar5 == 0) && (iVar1 = 1, iVar2 < attsMax)) {
      atts[iVar2].name = ptr;
      atts[iVar2].normalized = '\x01';
      iVar1 = 1;
    }
    goto switchD_005160b0_caseD_4;
  }
  iVar1 = 2;
  if (iVar2 < attsMax) {
    atts[iVar2].valuePtr = pcVar4 + 2;
    iVar1 = 2;
  }
  goto switchD_005160b0_caseD_4;
switchD_005160b0_caseD_b:
  iVar1 = 2;
  if (iVar5 != 2) {
    return iVar2;
  }
  goto switchD_005160b0_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr, int attsMax,
                ATTRIBUTE *atts) {
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define START_NAME                                                           \
    if (state == other) {                                                      \
      if (nAtts < attsMax) {                                                   \
        atts[nAtts].name = ptr;                                                \
        atts[nAtts].normalized = 1;                                            \
      }                                                                        \
      state = inName;                                                          \
    }
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n: /* NOTE: The encoding has already been validated. */        \
    START_NAME ptr += (n - MINBPC(enc));                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#  undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      } else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      } else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR:
    case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}